

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O2

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::~COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this,void **vtt)

{
  _func_int **pp_Var1;
  IImage *pIVar2;
  pointer ppIVar3;
  u32 i;
  ulong uVar4;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ITexture)._vptr_ITexture = pp_Var1;
  *(void **)((long)&(this->super_ITexture)._vptr_ITexture + (long)pp_Var1[-3]) = vtt[3];
  if (*(int *)&(this->super_ITexture).field_0x84 != 0) {
    (*GL.DeleteTextures)(1,(GLuint *)&(this->super_ITexture).field_0x84);
  }
  pIVar2 = this->LockImage;
  if (pIVar2 != (IImage *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)((long)&pIVar2->_vptr_IImage + (long)pIVar2->_vptr_IImage[-3]));
  }
  for (uVar4 = 0;
      ppIVar3 = (this->Images).m_data.
                super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar4 < ((ulong)((long)(this->Images).m_data.
                             super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3) >> 3 &
              0xffffffff); uVar4 = uVar4 + 1) {
    pIVar2 = ppIVar3[uVar4];
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&pIVar2->_vptr_IImage + (long)pIVar2->_vptr_IImage[0xfffffffffffffffd]));
  }
  std::_Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>::~_Vector_base
            ((_Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_> *)
             &this->Images);
  ITexture::~ITexture(&this->super_ITexture,vtt + 1);
  return;
}

Assistant:

virtual ~COpenGLCoreTexture()
	{
		if (TextureName)
			GL.DeleteTextures(1, &TextureName);

		if (LockImage)
			LockImage->drop();

		for (u32 i = 0; i < Images.size(); ++i)
			Images[i]->drop();
	}